

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityPart::CuriosityPart
          (CuriosityPart *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,bool collide)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  ChVector<double> local_68;
  ChQuaternion<double> local_48;
  
  this->_vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a08d8;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)&(this->m_mesh_name).field_2;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  local_48.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_mesh_xform,&local_68,&local_48);
  auVar2._8_4_ = 0x3f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar2);
  (this->m_color).R = (float)(int)uVar1;
  (this->m_color).G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_color).B = 1.0;
  ChFrame<double>::ChFrame(&this->m_pos,rel_pos);
  (this->m_inertia).m_data[2] = 0.0;
  (this->m_inertia).m_data[0] = 0.0;
  (this->m_inertia).m_data[1] = 0.0;
  local_48.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_cog,&local_68,&local_48);
  this->m_visualize = true;
  this->m_collide = collide;
  return;
}

Assistant:

CuriosityPart::CuriosityPart(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             bool collide)
    : m_name(name), m_pos(rel_pos), m_mat(mat), m_collide(collide), m_visualize(true) {}